

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

void KDict_MergeData(KonohaContext *kctx,KDict *dict,KKeyValue *kvs,size_t nitems,int isOverride)

{
  ksymbol_t kVar1;
  _func_KKeyValue_ptr_KonohaContext_ptr_KDict_ptr_ksymbol_t *p_Var2;
  _func_void_KonohaContext_ptr_KDict_ptr_KKeyValue_ptr *p_Var3;
  long lVar4;
  ktypeattr_t kVar5;
  undefined1 *__s;
  KKeyValue *pKVar6;
  KKeyValue *pKVar7;
  KKeyValue *pKStackY_50;
  KDict *in_stack_ffffffffffffffb8;
  KKeyValue *stored;
  kbool_t *foundItems;
  size_t i;
  int isOverride_local;
  size_t nitems_local;
  KKeyValue *kvs_local;
  KDict *dict_local;
  KonohaContext *kctx_local;
  
  if ((dict->data).bytesize >> 4 == 0) {
    pKStackY_50 = (KKeyValue *)0x1059ae;
    KDict_Ensure((KonohaContext *)CONCAT44(isOverride,(undefined4)i),(KDict *)foundItems,
                 (size_t)stored);
    pKStackY_50 = (KKeyValue *)0x1059c7;
    memcpy((dict->data).field_1.bytebuf,kvs,nitems << 4);
    (dict->data).bytesize = nitems << 4;
    pKStackY_50 = (KKeyValue *)0x1059e3;
    KDict_Sort((KonohaContext *)stored,in_stack_ffffffffffffffb8);
  }
  else {
    lVar4 = -(nitems + 0xf & 0xfffffffffffffff0);
    __s = &stack0xffffffffffffffb8 + lVar4;
    *(undefined8 *)((long)&pKStackY_50 + lVar4) = 0x105a14;
    memset(__s,0,nitems);
    for (foundItems = (kbool_t *)0x0; foundItems < nitems; foundItems = foundItems + 1) {
      p_Var2 = kctx->klib->KDict_GetNULL;
      kVar1 = kvs[(long)foundItems].key;
      *(undefined8 *)((long)&pKStackY_50 + lVar4) = 0x105a4d;
      pKVar6 = (*p_Var2)(kctx,dict,kVar1);
      if ((pKVar6 != (KKeyValue *)0x0) && (__s[(long)foundItems] = 1, isOverride != 0)) {
        pKVar7 = kvs + (long)foundItems;
        kVar5 = pKVar7->typeAttr;
        pKVar6->key = pKVar7->key;
        pKVar6->typeAttr = kVar5;
        pKVar6->field_2 = pKVar7->field_2;
      }
    }
    for (foundItems = (kbool_t *)0x0; foundItems < nitems; foundItems = foundItems + 1) {
      if ((__s[(long)foundItems] & 1) == 0) {
        p_Var3 = kctx->klib->KDict_Add;
        *(undefined8 *)((long)&pKStackY_50 + lVar4) = 0x105ae8;
        (*p_Var3)(kctx,dict,kvs + (long)foundItems);
      }
    }
  }
  return;
}

Assistant:

KLIBDECL void KDict_MergeData(KonohaContext *kctx, KDict *dict, KKeyValue *kvs, size_t nitems, int isOverride)
{
	size_t i;
	kbool_t *foundItems;
	if(KDict_size(dict) == 0) {
		KDict_Ensure(kctx, dict, nitems);
		memcpy(dict->data.keyValueItems, kvs, nitems * sizeof(KKeyValue));
		dict->data.bytesize = nitems * sizeof(KKeyValue);
		KDict_Sort(kctx, dict);
		return;
	}
	foundItems = ALLOCA(kbool_t, nitems);
	bzero(foundItems, sizeof(kbool_t) * nitems);
	for(i = 0; i < nitems; i++) {
		KKeyValue *stored = KLIB KDict_GetNULL(kctx, dict, kvs[i].key);
		if(stored != NULL) {
			foundItems[i] = true;
			if(isOverride) {
				stored[0] = kvs[i];
			}
		}
	}
	for(i = 0; i < nitems; i++) {
		if(!foundItems[i]) {
			KLIB KDict_Add(kctx, dict, kvs + i);
		}
	}
}